

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGFreeDocument(xmlRelaxNGDocumentPtr_conflict docu)

{
  xmlRelaxNGDocumentPtr_conflict docu_local;
  
  if (docu != (xmlRelaxNGDocumentPtr_conflict)0x0) {
    if (docu->href != (xmlChar *)0x0) {
      (*xmlFree)(docu->href);
    }
    if (docu->doc != (xmlDocPtr)0x0) {
      xmlFreeDoc(docu->doc);
    }
    if (docu->schema != (xmlRelaxNGPtr)0x0) {
      xmlRelaxNGFreeInnerSchema(docu->schema);
    }
    (*xmlFree)(docu);
  }
  return;
}

Assistant:

static void
xmlRelaxNGFreeDocument(xmlRelaxNGDocumentPtr docu)
{
    if (docu == NULL)
        return;

    if (docu->href != NULL)
        xmlFree(docu->href);
    if (docu->doc != NULL)
        xmlFreeDoc(docu->doc);
    if (docu->schema != NULL)
        xmlRelaxNGFreeInnerSchema(docu->schema);
    xmlFree(docu);
}